

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O2

Vector<int,_3> __thiscall tcu::Vector<int,_4>::toWidth<3>(Vector<int,_4> *this)

{
  long lVar1;
  int extraout_EDX;
  long in_RSI;
  Vector<int,_3> VVar2;
  
  Vector<int,_3>::Vector((Vector<int,_3> *)this);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    this->m_data[lVar1] = *(int *)(in_RSI + lVar1 * 4);
  }
  VVar2.m_data[2] = extraout_EDX;
  VVar2.m_data._0_8_ = this;
  return (Vector<int,_3>)VVar2.m_data;
}

Assistant:

inline Vector<T, NewSize> Vector<T, Size>::toWidth (void) const
{
	Vector<T, NewSize> res;
	int i;
	for (i = 0; i < deMin32(Size, NewSize); i++)
		res.m_data[i] = m_data[i];
	for (; i < NewSize; i++)
		res.m_data[i] = T(0);
	return res;
}